

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_keyword_all_write(NGP_HDU *ngph,fitsfile *ffp,int mode)

{
  int iVar1;
  long local_100;
  long l;
  char buf [200];
  int ib;
  int r;
  int i;
  int mode_local;
  fitsfile *ffp_local;
  NGP_HDU *ngph_local;
  
  if (ngph == (NGP_HDU *)0x0) {
    ngph_local._4_4_ = 0x16a;
  }
  else if (ffp == (fitsfile *)0x0) {
    ngph_local._4_4_ = 0x16a;
  }
  else {
    buf[0xc4] = '\0';
    buf[0xc5] = '\0';
    buf[0xc6] = '\0';
    buf[199] = '\0';
    for (ib = 0; ib < ngph->tokcnt; ib = ib + 1) {
      buf._196_4_ = ngp_keyword_is_write(ngph->tok + ib);
      if (((mode & 1U) == 0) && (buf._196_4_ != 0)) {
        if (buf._196_4_ == 0x170) {
          buf[0xc4] = '\0';
          buf[0xc5] = '\0';
          buf[0xc6] = '\0';
          buf[199] = '\0';
          if ((ngph->tok + ib != (NGP_TOKEN *)0xffffffffffffffa0) &&
             (ngph->tok[ib].comment[0] != '\0')) {
            ffmcom(ffp,ngph->tok[ib].name,ngph->tok[ib].comment,(int *)(buf + 0xc4));
          }
        }
        else {
          buf[0xc4] = '\0';
          buf[0xc5] = '\0';
          buf[0xc6] = '\0';
          buf[199] = '\0';
        }
      }
      else {
        switch(ngph->tok[ib].type) {
        case 1:
          buf._192_4_ = SEXT14(ngph->tok[ib].value.b);
          ffpky(ffp,0xe,ngph->tok[ib].name,buf + 0xc0,ngph->tok[ib].comment,(int *)(buf + 0xc4));
          break;
        case 2:
          ffpkls(ffp,ngph->tok[ib].name,ngph->tok[ib].value.s,ngph->tok[ib].comment,
                 (int *)(buf + 0xc4));
          break;
        case 3:
          local_100 = (long)ngph->tok[ib].value.i;
          ffpky(ffp,0x29,ngph->tok[ib].name,&local_100,ngph->tok[ib].comment,(int *)(buf + 0xc4));
          break;
        case 4:
          ffpky(ffp,0x52,ngph->tok[ib].name,&ngph->tok[ib].value,ngph->tok[ib].comment,
                (int *)(buf + 0xc4));
          break;
        case 5:
          ffpky(ffp,0xa3,ngph->tok[ib].name,&ngph->tok[ib].value,ngph->tok[ib].comment,
                (int *)(buf + 0xc4));
          break;
        case 6:
          ffpkyu(ffp,ngph->tok[ib].name,ngph->tok[ib].comment,(int *)(buf + 0xc4));
          break;
        case 7:
          iVar1 = strcmp("HISTORY",ngph->tok[ib].name);
          if (iVar1 == 0) {
            ffphis(ffp,ngph->tok[ib].comment,(int *)(buf + 0xc4));
          }
          else {
            iVar1 = strcmp("COMMENT",ngph->tok[ib].name);
            if (iVar1 == 0) {
              ffpcom(ffp,ngph->tok[ib].comment,(int *)(buf + 0xc4));
            }
            else {
              snprintf((char *)&l,200,"%-8.8s%s",ngph->tok[ib].name,ngph->tok[ib].comment);
              ffprec(ffp,(char *)&l,(int *)(buf + 0xc4));
            }
          }
        }
      }
      if (buf._196_4_ != 0) {
        iVar1._0_1_ = buf[0xc4];
        iVar1._1_1_ = buf[0xc5];
        iVar1._2_1_ = buf[0xc6];
        iVar1._3_1_ = buf[199];
        return iVar1;
      }
    }
    ffrdef(ffp,(int *)(buf + 0xc4));
    ngph_local._4_1_ = buf[0xc4];
    ngph_local._5_1_ = buf[0xc5];
    ngph_local._6_1_ = buf[0xc6];
    ngph_local._7_1_ = buf[199];
  }
  return ngph_local._4_4_;
}

Assistant:

int     ngp_keyword_all_write(NGP_HDU *ngph, fitsfile *ffp, int mode)
 { int		i, r, ib;
   char		buf[200];
   long		l;


   if (NULL == ngph) return(NGP_NUL_PTR);
   if (NULL == ffp) return(NGP_NUL_PTR);
   r = NGP_OK;
   
   for (i=0; i<ngph->tokcnt; i++)
    { r = ngp_keyword_is_write(&(ngph->tok[i]));
      if ((NGP_REALLY_ALL & mode) || (NGP_OK == r))
        { switch (ngph->tok[i].type)
           { case NGP_TTYPE_BOOL:
			ib = ngph->tok[i].value.b;
			fits_write_key(ffp, TLOGICAL, ngph->tok[i].name, &ib, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_STRING:
			fits_write_key_longstr(ffp, ngph->tok[i].name, ngph->tok[i].value.s, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_INT:
			l = ngph->tok[i].value.i;	/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
			fits_write_key(ffp, TLONG, ngph->tok[i].name, &l, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_REAL:
			fits_write_key(ffp, TDOUBLE, ngph->tok[i].name, &(ngph->tok[i].value.d), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_COMPLEX:
			fits_write_key(ffp, TDBLCOMPLEX, ngph->tok[i].name, &(ngph->tok[i].value.c), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_NULL:
			fits_write_key_null(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_RAW:
			if (0 == strcmp("HISTORY", ngph->tok[i].name))
			  { fits_write_history(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			if (0 == strcmp("COMMENT", ngph->tok[i].name))
			  { fits_write_comment(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			snprintf(buf,200, "%-8.8s%s", ngph->tok[i].name, ngph->tok[i].comment);
			fits_write_record(ffp, buf, &r);
                        break;
           }
        }
      else if (NGP_BAD_ARG == r) /* enhancement 10 dec 2003, James Peachey: template comments replace defaults */
        { r = NGP_OK;						/* update comments of special keywords like TFORM */
          if (ngph->tok[i].comment && *ngph->tok[i].comment)	/* do not update with a blank comment */
            { fits_modify_comment(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
            }
        }
      else /* other problem, typically a blank token */
        { r = NGP_OK;						/* skip this token, but continue */
        }
      if (r) return(r);
    }
     
   fits_set_hdustruc(ffp, &r);				/* resync cfitsio */
   return(r);
 }